

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

type * __thiscall
linalg::detail::apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double>::impl<0,1,2,3>
          (double param_1,type *__return_storage_ptr__,
          apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = *(double *)(this + 8);
  dVar2 = *(double *)(this + 0x10);
  dVar3 = *(double *)(this + 0x18);
  dVar4 = *(double *)(this + 0x20);
  dVar5 = *(double *)(this + 0x28);
  dVar6 = *(double *)(this + 0x30);
  dVar7 = *(double *)(this + 0x38);
  dVar8 = *(double *)(this + 0x40);
  dVar9 = *(double *)(this + 0x48);
  dVar10 = *(double *)(this + 0x50);
  dVar11 = *(double *)(this + 0x58);
  dVar12 = *(double *)(this + 0x60);
  dVar13 = *(double *)(this + 0x68);
  dVar14 = *(double *)(this + 0x70);
  dVar15 = *(double *)(this + 0x78);
  (__return_storage_ptr__->x).x = *(double *)this / param_1;
  (__return_storage_ptr__->x).y = dVar1 / param_1;
  (__return_storage_ptr__->x).z = dVar2 / param_1;
  (__return_storage_ptr__->x).w = dVar3 / param_1;
  (__return_storage_ptr__->y).x = dVar4 / param_1;
  (__return_storage_ptr__->y).y = dVar5 / param_1;
  (__return_storage_ptr__->y).z = dVar6 / param_1;
  (__return_storage_ptr__->y).w = dVar7 / param_1;
  (__return_storage_ptr__->z).x = dVar8 / param_1;
  (__return_storage_ptr__->z).y = dVar9 / param_1;
  (__return_storage_ptr__->z).z = dVar10 / param_1;
  (__return_storage_ptr__->z).w = dVar11 / param_1;
  (__return_storage_ptr__->w).x = dVar12 / param_1;
  (__return_storage_ptr__->w).y = dVar13 / param_1;
  (__return_storage_ptr__->w).z = dVar14 / param_1;
  (__return_storage_ptr__->w).w = dVar15 / param_1;
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<J...>, F f, const mat<A,M,N> & a, const mat<B,M,N> & b) { return {apply<F, void, vec<A,M>, vec<B,M>>::impl(make_seq<0,M>{}, f, getter<J>{}(a), getter<J>{}(b))...}; }